

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void ssh_throttle_conn(Ssh *ssh,int adjust)

{
  int iVar1;
  _Bool local_25;
  _Bool frozen;
  int old_count;
  server *srv;
  int adjust_local;
  Ssh *ssh_local;
  
  iVar1 = ssh[-0x16].dummy;
  ssh[-0x16].dummy = adjust + ssh[-0x16].dummy;
  if (ssh[-0x16].dummy < 0) {
    __assert_fail("srv->conn_throttle_count >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/server.c",
                  0xd1,"void ssh_throttle_conn(Ssh *, int)");
  }
  if ((ssh[-0x16].dummy == 0) || (iVar1 != 0)) {
    if (ssh[-0x16].dummy != 0) {
      return;
    }
    if (iVar1 == 0) {
      return;
    }
    local_25 = false;
  }
  else {
    local_25 = true;
  }
  *(_Bool *)&ssh[-0x15].dummy = local_25;
  if (*(long *)(ssh + -0x1a) != 0) {
    sk_set_frozen(*(Socket **)(ssh + -0x1a),local_25);
    queue_idempotent_callback((IdempotentCallback *)(*(long *)(ssh + 4) + 0xa8));
  }
  return;
}

Assistant:

void ssh_throttle_conn(Ssh *ssh, int adjust)
{
    server *srv = container_of(ssh, server, ssh);
    int old_count = srv->conn_throttle_count;
    bool frozen;

    srv->conn_throttle_count += adjust;
    assert(srv->conn_throttle_count >= 0);

    if (srv->conn_throttle_count && !old_count) {
        frozen = true;
    } else if (!srv->conn_throttle_count && old_count) {
        frozen = false;
    } else {
        return;                /* don't change current frozen state */
    }

    srv->frozen = frozen;

    if (srv->socket) {
        sk_set_frozen(srv->socket, frozen);

        /*
         * Now process any SSH connection data that was stashed in our
         * queue while we were frozen.
         */
        queue_idempotent_callback(&srv->bpp->ic_in_raw);
    }
}